

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aipc.c
# Opt level: O0

void nn_aipc_start(nn_aipc *self,nn_usock *listener)

{
  size_t sz;
  nn_usock *listener_local;
  nn_aipc *self_local;
  
  if (self->state != 1) {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self->state,
            "NN_AIPC_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/aipc.c"
            ,0x55);
    fflush(_stderr);
    nn_err_abort();
  }
  self->listener = listener;
  (self->listener_owner).src = 3;
  (self->listener_owner).fsm = &self->fsm;
  nn_usock_swap_owner(listener,&self->listener_owner);
  nn_fsm_start(&self->fsm);
  return;
}

Assistant:

void nn_aipc_start (struct nn_aipc *self, struct nn_usock *listener)
{
    size_t sz;
    nn_assert_state (self, NN_AIPC_STATE_IDLE);

    /*  Take ownership of the listener socket. */
    self->listener = listener;
    self->listener_owner.src = NN_AIPC_SRC_LISTENER;
    self->listener_owner.fsm = &self->fsm;
    nn_usock_swap_owner (listener, &self->listener_owner);

#if defined NN_HAVE_WINDOWS
    /* Get/Set security attribute pointer*/
    nn_epbase_getopt (self->epbase, NN_IPC, NN_IPC_SEC_ATTR, &self->usock.sec_attr, &sz);

    nn_epbase_getopt (self->epbase, NN_IPC, NN_IPC_OUTBUFSZ, &self->usock.outbuffersz, &sz);
    nn_epbase_getopt (self->epbase, NN_IPC, NN_IPC_INBUFSZ, &self->usock.inbuffersz, &sz);
#endif

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}